

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtectorChain.cpp
# Opt level: O0

bool __thiscall
CppUnit::ProtectorChain::protect(ProtectorChain *this,Functor *functor,ProtectorContext *context)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  reference ppFVar5;
  ProtectFunctor *this_00;
  reference ppPVar6;
  value_type local_c0;
  uint local_b0;
  uint deletingIndex;
  bool succeed;
  Functor *outermostFunctor;
  ProtectFunctor *local_90;
  value_type local_88;
  Functor *protectedFunctor;
  undefined1 local_78 [4];
  int index;
  Functors functors;
  ProtectorContext *context_local;
  Functor *functor_local;
  ProtectorChain *this_local;
  
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)context;
  bVar1 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::empty
                    (&this->m_protectors);
  if (bVar1) {
    iVar3 = (*functor->_vptr_Functor[2])();
    bVar2 = (byte)iVar3;
  }
  else {
    std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::deque
              ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)local_78);
    sVar4 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::size
                      (&this->m_protectors);
    protectedFunctor._4_4_ = (int)sVar4;
    while (protectedFunctor._4_4_ = protectedFunctor._4_4_ + -1, -1 < protectedFunctor._4_4_) {
      bVar1 = std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::empty
                        ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)local_78)
      ;
      local_c0 = functor;
      if (!bVar1) {
        ppFVar5 = std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::back
                            ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)
                             local_78);
        local_c0 = *ppFVar5;
      }
      local_88 = local_c0;
      this_00 = (ProtectFunctor *)operator_new(0x20);
      ppPVar6 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::operator[]
                          (&this->m_protectors,(long)protectedFunctor._4_4_);
      ProtectFunctor::ProtectFunctor
                (this_00,*ppPVar6,local_88,
                 (ProtectorContext *)
                 functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
      local_90 = this_00;
      std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::push_back
                ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)local_78,
                 (value_type *)&local_90);
    }
    ppFVar5 = std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::back
                        ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)local_78)
    ;
    iVar3 = (*(*ppFVar5)->_vptr_Functor[2])();
    bVar2 = (byte)iVar3;
    for (local_b0 = 0;
        sVar4 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::size
                          (&this->m_protectors), local_b0 < sVar4; local_b0 = local_b0 + 1) {
      ppFVar5 = std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::operator[]
                          ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)
                           local_78,(ulong)local_b0);
      if (*ppFVar5 != (value_type)0x0) {
        (*(*ppFVar5)->_vptr_Functor[1])();
      }
    }
    std::deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::~deque
              ((deque<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)local_78);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool 
ProtectorChain::protect( const Functor &functor,
                         const ProtectorContext &context )
{
  if ( m_protectors.empty() )
    return functor();

  Functors functors;
  for ( int index = m_protectors.size()-1; index >= 0; --index )
  {
    const Functor &protectedFunctor = 
              functors.empty() ? functor : *functors.back();

    functors.push_back( new ProtectFunctor( m_protectors[index],
                                            protectedFunctor, 
                                            context ) );
  }

  const Functor &outermostFunctor = *functors.back();
  bool succeed = outermostFunctor();

  for ( unsigned int deletingIndex = 0; deletingIndex < m_protectors.size(); ++deletingIndex )
    delete functors[deletingIndex];

  return succeed;
}